

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredictSensorsMeasurements.cpp
# Opt level: O0

bool iDynTree::predictSensorsMeasurementsFromRawBuffers
               (Model *model,Traversal *traversal,LinkVelArray *buf_linkVel,
               LinkAccArray *buf_linkProperAcc,LinkInternalWrenches *buf_internalWrenches,
               SensorsMeasurements *predictedMeasurement)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  Sensor *pSVar4;
  undefined4 extraout_var;
  LinkAccArray *this;
  Model *in_RDI;
  Vector3 predictedAngAcc;
  LinkIndex parentLinkId_2;
  ThreeAxisAngularAccelerometerSensor *angAccelerometer;
  size_t idx_3;
  uint numAngAccl;
  AngVelocity predictedAngVel;
  LinkIndex parentLinkId_1;
  GyroscopeSensor *gyroscope;
  size_t idx_2;
  uint numGyro;
  LinAcceleration predictedAcc;
  LinkIndex parentLinkId;
  AccelerometerSensor *accelerometer;
  size_t idx_1;
  uint numAccl;
  Wrench predictedWrench;
  SixAxisForceTorqueSensor *ftSens;
  size_t idx;
  size_t numOfFTs;
  bool retVal;
  SensorType *in_stack_fffffffffffffe18;
  SensorsList *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  Wrench *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  SensorType *in_stack_fffffffffffffe40;
  SensorsMeasurements *in_stack_fffffffffffffe48;
  bool local_1ab;
  bool local_1a9;
  ulong local_168;
  Twist *in_stack_fffffffffffffeb8;
  GyroscopeSensor *in_stack_fffffffffffffec0;
  SpatialAcc *in_stack_fffffffffffffec8;
  ThreeAxisAngularAccelerometerSensor *in_stack_fffffffffffffed0;
  Wrench *in_stack_fffffffffffffee0;
  ptrdiff_t *in_stack_fffffffffffffee8;
  ptrdiff_t *sensor_index;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffef4;
  SensorsMeasurements *in_stack_fffffffffffffef8;
  SensorsMeasurements *local_c8;
  Twist *in_stack_ffffffffffffff90;
  SpatialAcc *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_50;
  bool local_31;
  
  local_31 = true;
  Model::sensors(in_RDI);
  sVar3 = SensorsList::getNrOfSensors(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_50 = 0; local_50 < sVar3; local_50 = local_50 + 1) {
    Model::sensors(in_RDI);
    in_stack_ffffffffffffffa4 = 0;
    SensorsList::getSensor
              ((SensorsList *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               (SensorType *)in_stack_fffffffffffffe30,
               CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    SixAxisForceTorqueSensor::predictMeasurement
              ((SixAxisForceTorqueSensor *)parentLinkId_2,(Traversal *)predictedAngAcc.m_data[2],
               (LinkInternalWrenches *)predictedAngAcc.m_data[1]);
    local_1a9 = false;
    if (local_31 != false) {
      local_1a9 = SensorsMeasurements::setMeasurement
                            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                             (ptrdiff_t *)
                             CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                             in_stack_fffffffffffffe30);
    }
    local_31 = local_1a9;
    Wrench::~Wrench((Wrench *)0x490708);
  }
  Model::sensors(in_RDI);
  sVar3 = SensorsList::getNrOfSensors(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_c8 = (SensorsMeasurements *)0x0; local_c8 < (SensorsMeasurements *)(sVar3 & 0xffffffff)
      ; local_c8 = (SensorsMeasurements *)((long)&local_c8->_vptr_SensorsMeasurements + 1)) {
    Model::sensors(in_RDI);
    pSVar4 = SensorsList::getSensor
                       ((SensorsList *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38)
                        ,(SensorType *)in_stack_fffffffffffffe30,
                        CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    (*pSVar4->_vptr_Sensor[10])();
    LinkAccArray::operator()
              ((LinkAccArray *)in_stack_fffffffffffffe20,(LinkIndex)in_stack_fffffffffffffe18);
    LinkVelArray::operator()
              ((LinkVelArray *)in_stack_fffffffffffffe20,(LinkIndex)in_stack_fffffffffffffe18);
    AccelerometerSensor::predictMeasurement
              ((AccelerometerSensor *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    local_1ab = false;
    if (local_31 != false) {
      in_stack_fffffffffffffef8 = local_c8;
      local_1ab = SensorsMeasurements::setMeasurement
                            (local_c8,(SensorType *)
                                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffee8,(Vector3 *)in_stack_fffffffffffffee0);
    }
    local_31 = local_1ab;
  }
  Model::sensors(in_RDI);
  uVar5 = 2;
  sVar3 = SensorsList::getNrOfSensors(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  uVar1 = (uint)sVar3;
  for (sensor_index = (ptrdiff_t *)0x0; sensor_index < (ptrdiff_t *)(ulong)uVar1;
      sensor_index = (ptrdiff_t *)((long)sensor_index + 1)) {
    Model::sensors(in_RDI);
    in_stack_fffffffffffffe30 =
         (Wrench *)
         SensorsList::getSensor
                   ((SensorsList *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                    (SensorType *)in_stack_fffffffffffffe30,
                    CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    iVar2 = (*(*(_func_int ***)in_stack_fffffffffffffe30)[10])();
    in_stack_fffffffffffffed0 = (ThreeAxisAngularAccelerometerSensor *)CONCAT44(extraout_var,iVar2);
    in_stack_fffffffffffffee0 = in_stack_fffffffffffffe30;
    LinkVelArray::operator()
              ((LinkVelArray *)in_stack_fffffffffffffe20,(LinkIndex)in_stack_fffffffffffffe18);
    GyroscopeSensor::predictMeasurement(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffe3f = false;
    if (local_31 != false) {
      in_stack_fffffffffffffe3f =
           SensorsMeasurements::setMeasurement
                     (in_stack_fffffffffffffef8,(SensorType *)CONCAT44(uVar1,uVar5),sensor_index,
                      (Vector3 *)in_stack_fffffffffffffee0);
    }
    local_31 = (bool)in_stack_fffffffffffffe3f;
  }
  Model::sensors(in_RDI);
  sVar3 = SensorsList::getNrOfSensors(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  for (local_168 = 0; local_168 < (sVar3 & 0xffffffff); local_168 = local_168 + 1) {
    Model::sensors(in_RDI);
    this = (LinkAccArray *)
           SensorsList::getSensor
                     ((SensorsList *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                      (SensorType *)in_stack_fffffffffffffe30,
                      CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    (*(code *)(this->m_linkAcc).
              super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>.
              _M_impl.super__Vector_impl_data._M_start[1].super_SpatialMotionVector.
              super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1]
    )();
    LinkAccArray::operator()(this,(LinkIndex)in_stack_fffffffffffffe18);
    ThreeAxisAngularAccelerometerSensor::predictMeasurement
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    in_stack_fffffffffffffe2f = false;
    if (local_31 != false) {
      in_stack_fffffffffffffe2f =
           SensorsMeasurements::setMeasurement
                     (in_stack_fffffffffffffef8,(SensorType *)CONCAT44(uVar1,uVar5),sensor_index,
                      (Vector3 *)in_stack_fffffffffffffee0);
    }
    local_31 = (bool)in_stack_fffffffffffffe2f;
  }
  return local_31;
}

Assistant:

bool predictSensorsMeasurementsFromRawBuffers(const Model& model,
                                              const Traversal& traversal,
                                              const LinkVelArray& buf_linkVel,
                                              const LinkAccArray& buf_linkProperAcc,
                                              const LinkInternalWrenches& buf_internalWrenches,
                                              SensorsMeasurements& predictedMeasurement)
{
    bool retVal = true;

    size_t numOfFTs = model.sensors().getNrOfSensors(iDynTree::SIX_AXIS_FORCE_TORQUE);
    for(size_t idx = 0; idx<numOfFTs; idx++)
    {
        SixAxisForceTorqueSensor * ftSens = (SixAxisForceTorqueSensor*)model.sensors().getSensor(iDynTree::SIX_AXIS_FORCE_TORQUE, idx);

        Wrench predictedWrench = ftSens->predictMeasurement(traversal,buf_internalWrenches);
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::SIX_AXIS_FORCE_TORQUE,idx,predictedWrench);
    }


    //Iterate through each accelrometer and find its parent. Compute local (classical accelration)
    // It is automatically proper acceleration since gravity is incorporated into the base acceleration
    unsigned int numAccl = model.sensors().getNrOfSensors(iDynTree::ACCELEROMETER);
    for(size_t idx = 0; idx<numAccl; idx++)
    {
        AccelerometerSensor * accelerometer = (AccelerometerSensor *)model.sensors().getSensor(iDynTree::ACCELEROMETER, idx);
        LinkIndex parentLinkId = accelerometer->getParentLinkIndex();
        LinAcceleration predictedAcc = accelerometer->predictMeasurement(buf_linkProperAcc(parentLinkId),
                                                                         buf_linkVel(parentLinkId));
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::ACCELEROMETER,idx,predictedAcc);
    }

    unsigned int numGyro = model.sensors().getNrOfSensors(iDynTree::GYROSCOPE);
    for(size_t idx = 0; idx<numGyro; idx++)
    {
        GyroscopeSensor * gyroscope = (GyroscopeSensor*)model.sensors().getSensor(iDynTree::GYROSCOPE, idx);
        LinkIndex parentLinkId = gyroscope->getParentLinkIndex();
        AngVelocity predictedAngVel = gyroscope->predictMeasurement(buf_linkVel(parentLinkId));
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::GYROSCOPE,idx,predictedAngVel);
    }

    unsigned int numAngAccl = model.sensors().getNrOfSensors(iDynTree::THREE_AXIS_ANGULAR_ACCELEROMETER);
    for(size_t idx = 0; idx<numAngAccl; idx++)
    {
        ThreeAxisAngularAccelerometerSensor * angAccelerometer =
        (ThreeAxisAngularAccelerometerSensor*)model.sensors().getSensor(iDynTree::THREE_AXIS_ANGULAR_ACCELEROMETER, idx);
        LinkIndex parentLinkId = angAccelerometer->getParentLinkIndex();
        Vector3 predictedAngAcc = angAccelerometer->predictMeasurement(buf_linkProperAcc(parentLinkId));
        retVal = retVal && predictedMeasurement.setMeasurement(iDynTree::THREE_AXIS_ANGULAR_ACCELEROMETER,idx,predictedAngAcc);
    }

    return retVal;
}